

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_bc7enc.cpp
# Opt level: O3

uint64_t basisu::pack_astc_4bit_3bit_to_one_color
                   (color_cell_compressor_params *pParams,color_cell_compressor_results *pResults,
                   uint32_t r,uint32_t g,uint32_t b,uint8_t *pSelectors)

{
  uint8_t uVar1;
  uint8_t uVar2;
  color_quad_u8 *pcVar3;
  long lVar4;
  uint64_t uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  byte local_4c [28];
  
  uVar1 = (&DAT_00364502)[(ulong)g * 4];
  uVar2 = (&DAT_00364502)[(ulong)b * 4];
  (pResults->m_low_endpoint).m_c[0] = (&DAT_00364502)[(ulong)r * 4];
  (pResults->m_low_endpoint).m_c[1] = uVar1;
  (pResults->m_low_endpoint).m_c[2] = uVar2;
  (pResults->m_low_endpoint).m_c[3] = '\0';
  uVar1 = (&DAT_00364503)[(ulong)g * 4];
  uVar2 = (&DAT_00364503)[(ulong)b * 4];
  (pResults->m_high_endpoint).m_c[0] = (&DAT_00364503)[(ulong)r * 4];
  (pResults->m_high_endpoint).m_c[1] = uVar1;
  (pResults->m_high_endpoint).m_c[2] = uVar2;
  *(undefined1 *)((long)pResults->m_pbits + 7) = 0;
  *(undefined8 *)((pResults->m_high_endpoint).m_c + 3) = 0;
  lVar4 = 0x2c;
  do {
    *(undefined *)((long)(&pResults->m_low_endpoint + -3) + lVar4) =
         (&DAT_00361301)
         [(ulong)*(byte *)((long)(&pResults->m_low_endpoint + -0xb) + lVar4) * 2 +
          (ulong)pParams->m_astc_endpoint_range * 0x200];
    *(undefined *)
     ((long)&((color_cell_compressor_results *)(&pResults->m_low_endpoint + -2))->m_best_overall_err
     + lVar4) = (&DAT_00361301)
                [(ulong)*(byte *)((long)(&pResults->m_low_endpoint + -10) + lVar4) * 2 +
                 (ulong)pParams->m_astc_endpoint_range * 0x200];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x30);
  memset(pSelectors,2,(ulong)pParams->m_num_pixels);
  lVar4 = 0;
  do {
    uVar7 = (uint)(pResults->m_low_endpoint).m_c[lVar4];
    uVar7 = uVar7 << 4 | uVar7;
    uVar8 = (uint)(pResults->m_high_endpoint).m_c[lVar4];
    uVar8 = uVar8 << 4 | uVar8;
    local_4c[lVar4] =
         (byte)((uVar7 << 8 | uVar7) * 0x2e + (uVar8 << 8 | uVar8) * 0x12 + 0x20 >> 0xe);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  if ((ulong)pParams->m_num_pixels == 0) {
    uVar5 = 0;
  }
  else {
    pcVar3 = pParams->m_pPixels;
    iVar9 = (uint)local_4c[2] + ((uint)local_4c[2] + (uint)local_4c[2] * 8) * 4 +
            (uint)local_4c[1] * 0x16e + (uint)local_4c[0] * 0x6d;
    uVar11 = 0;
    uVar5 = 0;
    do {
      uVar7 = (uint)pcVar3[uVar11].m_c[0];
      if (pParams->m_perceptual == '\0') {
        iVar10 = local_4c[0] - uVar7;
        iVar12 = (uint)local_4c[1] - (uint)pcVar3[uVar11].m_c[1];
        iVar6 = (uint)local_4c[2] - (uint)pcVar3[uVar11].m_c[2];
      }
      else {
        iVar6 = (uint)pcVar3[uVar11].m_c[2] * 0x25 +
                (uint)pcVar3[uVar11].m_c[1] * 0x16e + uVar7 * 0x6d;
        iVar10 = iVar9 - iVar6 >> 8;
        iVar12 = (int)(((local_4c[0] - uVar7) * 0x200 - iVar9) + iVar6) >> 8;
        iVar6 = (int)(((uint)local_4c[2] * 0x200 - ((uint)pcVar3[uVar11].m_c[2] * 0x200 + iVar9)) +
                     iVar6) >> 8;
      }
      uVar5 = uVar5 + (iVar6 * iVar6 * pParams->m_weights[2] +
                      iVar12 * iVar12 * pParams->m_weights[1] +
                      iVar10 * iVar10 * pParams->m_weights[0]);
      uVar11 = uVar11 + 1;
    } while (pParams->m_num_pixels != uVar11);
  }
  pResults->m_best_overall_err = uVar5;
  return uVar5;
}

Assistant:

static uint64_t pack_astc_4bit_3bit_to_one_color(const color_cell_compressor_params *pParams, color_cell_compressor_results *pResults, uint32_t r, uint32_t g, uint32_t b, uint8_t *pSelectors)
{
	const endpoint_err *pEr = &g_astc_4bit_3bit_optimal_endpoints[r];
	const endpoint_err *pEg = &g_astc_4bit_3bit_optimal_endpoints[g];
	const endpoint_err *pEb = &g_astc_4bit_3bit_optimal_endpoints[b];

	color_quad_u8_set(&pResults->m_low_endpoint, pEr->m_lo, pEg->m_lo, pEb->m_lo, 0);
	color_quad_u8_set(&pResults->m_high_endpoint, pEr->m_hi, pEg->m_hi, pEb->m_hi, 0);
	pResults->m_pbits[0] = 0;
	pResults->m_pbits[1] = 0;

	for (uint32_t i = 0; i < 4; i++)
	{
		pResults->m_astc_low_endpoint.m_c[i] = g_astc_sorted_order_unquant[pParams->m_astc_endpoint_range][pResults->m_low_endpoint.m_c[i]].m_index;
		pResults->m_astc_high_endpoint.m_c[i] = g_astc_sorted_order_unquant[pParams->m_astc_endpoint_range][pResults->m_high_endpoint.m_c[i]].m_index;
	}

	memset(pSelectors, BC7ENC_ASTC_4BIT_3BIT_OPTIMAL_INDEX, pParams->m_num_pixels);

	color_quad_u8 p;
	for (uint32_t i = 0; i < 3; i++)
	{
		uint32_t low = (pResults->m_low_endpoint.m_c[i] << 4) | pResults->m_low_endpoint.m_c[i];
		uint32_t high = (pResults->m_high_endpoint.m_c[i] << 4) | pResults->m_high_endpoint.m_c[i];
		
		p.m_c[i] = (uint8_t)astc_interpolate_linear(low, high, g_bc7_weights3[BC7ENC_ASTC_4BIT_3BIT_OPTIMAL_INDEX]);
	}
	p.m_c[3] = 255;

	uint64_t total_err = 0;
	for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
		total_err += compute_color_distance_rgb(&p, &pParams->m_pPixels[i], pParams->m_perceptual, pParams->m_weights);

	pResults->m_best_overall_err = total_err;

	return total_err;
}